

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_kernel.h
# Opt level: O1

void __thiscall
dlib::array<dlib::tabbed_display::tab_data,_dlib::memory_manager_stateless_kernel_1<char>_>::
set_size(array<dlib::tabbed_display::tab_data,_dlib::memory_manager_stateless_kernel_1<char>_> *this
        ,unsigned_long size)

{
  tab_data *ptVar1;
  ostream *poVar2;
  fatal_error *this_00;
  ostringstream dlib_o_out;
  string sStack_1b8;
  undefined1 local_198 [376];
  
  if (size <= this->max_array_size) {
    (*(this->super_enumerable<dlib::tabbed_display::tab_data>)._vptr_enumerable[3])(this);
    this->array_size = size;
    ptVar1 = this->array_elements + (size - 1);
    if (size == 0) {
      ptVar1 = (tab_data *)0x0;
    }
    this->last_pos = ptVar1;
    return;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,"\n\nError detected at line ",0x19);
  poVar2 = (ostream *)std::ostream::operator<<(local_198,0x184);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,".\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,"Error detected in file ",0x17);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,
             "/workspace/llm4binary/github/license_all_cmakelists_25/e-fominov[P]dlib/dlib/gui_widgets/../gui_core/../threads/../array/array_kernel.h"
             ,0x87);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,".\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,"Error detected in function ",0x1b);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,
             "void dlib::array<dlib::tabbed_display::tab_data>::set_size(unsigned long) [T = dlib::tabbed_display::tab_data, mem_manager = dlib::memory_manager_stateless_kernel_1<char>]"
             ,0xab);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,".\n\n",3);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,"Failing expression was ",0x17);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,"( size <= this->max_size() )",0x1c);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,".\n",2);
  *(uint *)(*(_func_int **)(local_198._0_8_ + -0x18) + (long)(local_198 + 0x18)) =
       *(uint *)(*(_func_int **)(local_198._0_8_ + -0x18) + (long)(local_198 + 0x18)) | 1;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,"\tvoid array::set_size",0x15);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,"\n\tsize must be <= max_size()",0x1c);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"\n\tsize: ",8);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)local_198);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n\tmax size: ",0xc);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n\tthis: ",8);
  poVar2 = std::ostream::_M_insert<void_const*>(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  this_00 = (fatal_error *)__cxa_allocate_exception(0x30);
  std::__cxx11::stringbuf::str();
  fatal_error::fatal_error(this_00,EBROKEN_ASSERT,&sStack_1b8);
  __cxa_throw(this_00,&fatal_error::typeinfo,error::~error);
}

Assistant:

void array<T,mem_manager>::
    set_size (
        unsigned long size
    )
    {
        // make sure requires clause is not broken
        DLIB_CASSERT(( size <= this->max_size() ),
            "\tvoid array::set_size"
            << "\n\tsize must be <= max_size()"
            << "\n\tsize: " << size 
            << "\n\tmax size: " << this->max_size()
            << "\n\tthis: " << this
            );

        reset();
        array_size = size;
        if (size > 0)
            last_pos = array_elements + size - 1;
        else
            last_pos = 0;
    }